

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

void __thiscall Fad<Fad<double>_>::Fad(Fad<Fad<double>_> *this,int sz,Fad<double> *x)

{
  Fad<double> local_38;
  
  Fad<double>::Fad(&this->val_,x);
  local_38.val_ = 0.0;
  local_38.dx_.num_elts = 0;
  local_38.dx_.ptr_to_data = (double *)0x0;
  local_38.defaultVal = 0.0;
  Vector<Fad<double>_>::Vector(&this->dx_,sz,&local_38);
  Fad<double>::~Fad(&local_38);
  (this->defaultVal).val_ = 0.0;
  (this->defaultVal).dx_.num_elts = 0;
  (this->defaultVal).dx_.ptr_to_data = (double *)0x0;
  (this->defaultVal).defaultVal = 0.0;
  return;
}

Assistant:

Fad(const int sz, const T & x) : val_(x), dx_(sz,T(0)), defaultVal(T(0)) {;}